

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O2

int pkey_gost_mac_ctrl_str(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long in_RAX;
  size_t sVar5;
  undefined8 *ptr;
  undefined2 *puVar6;
  long lVar7;
  ASN1_OBJECT *a;
  gost_cipher_info *pgVar8;
  void *pvVar9;
  int reason;
  gost_cipher_info *param;
  long keylen;
  
  keylen = in_RAX;
  iVar4 = strcmp(type,"key");
  if (iVar4 == 0) {
    sVar5 = strlen(value);
    if (sVar5 == 0x20) {
      puVar6 = (undefined2 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
      uVar1 = *(undefined8 *)(value + 8);
      uVar2 = *(undefined8 *)(value + 0x10);
      uVar3 = *(undefined8 *)(value + 0x18);
      *(undefined8 *)(puVar6 + 8) = *(undefined8 *)value;
      *(undefined8 *)(puVar6 + 0xc) = uVar1;
      *(undefined8 *)(puVar6 + 0x10) = uVar2;
      *(undefined8 *)(puVar6 + 0x14) = uVar3;
      *puVar6 = 1;
      return 1;
    }
    reason = 0x72;
    iVar4 = 0x2df;
  }
  else {
    iVar4 = strcmp(type,"hexkey");
    if (iVar4 == 0) {
      ptr = (undefined8 *)OPENSSL_hexstr2buf(value,&keylen);
      if ((ptr != (undefined8 *)0x0) && (keylen == 0x20)) {
        puVar6 = (undefined2 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
        uVar1 = ptr[1];
        uVar2 = ptr[2];
        uVar3 = ptr[3];
        *(undefined8 *)(puVar6 + 8) = *ptr;
        *(undefined8 *)(puVar6 + 0xc) = uVar1;
        *(undefined8 *)(puVar6 + 0x10) = uVar2;
        *(undefined8 *)(puVar6 + 0x14) = uVar3;
        *puVar6 = 1;
        CRYPTO_free(ptr);
        return 1;
      }
      ERR_GOST_error(0x81,0x72,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                     ,0x2eb);
      CRYPTO_free(ptr);
      return 0;
    }
    iVar4 = strcmp(type,"size");
    if (iVar4 == 0) {
      lVar7 = strtol(value,(char **)&keylen,10);
      if (*(char *)keylen == '\0') {
        iVar4 = pkey_gost_mac_ctrl(ctx,0x1005,(int)lVar7,(void *)0x0);
        return iVar4;
      }
      reason = 0x75;
      iVar4 = 0x2f8;
    }
    else {
      iVar4 = strcmp(type,"paramset");
      if (iVar4 != 0) {
        return -2;
      }
      a = OBJ_txt2obj(value,0);
      if (a == (ASN1_OBJECT *)0x0) {
        ERR_GOST_error(0x81,0x74,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                       ,0x301);
        return 0;
      }
      pgVar8 = get_encryption_params((ASN1_OBJECT *)a);
      ASN1_OBJECT_free(a);
      if (pgVar8 != (gost_cipher_info *)0x0) {
        pvVar9 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
        *(int *)((long)pvVar9 + 4) = pgVar8->nid;
        return 1;
      }
      reason = 0x74;
      iVar4 = 0x308;
    }
  }
  ERR_GOST_error(0x81,reason,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                 ,iVar4);
  return 0;
}

Assistant:

static int pkey_gost_mac_ctrl_str(EVP_PKEY_CTX *ctx,
                                  const char *type, const char *value)
{
    if (strcmp(type, key_ctrl_string) == 0) {
        if (strlen(value) != 32) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            return 0;
        }
        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY,
                                  32, (char *)value);
    }
    if (strcmp(type, hexkey_ctrl_string) == 0) {
        long keylen;
        int ret;
        unsigned char *keybuf = string_to_hex(value, &keylen);
        if (!keybuf || keylen != 32) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR,
                    GOST_R_INVALID_MAC_KEY_LENGTH);
            OPENSSL_free(keybuf);
            return 0;
        }
        ret = pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_SET_MAC_KEY, 32, keybuf);
        OPENSSL_free(keybuf);
        return ret;

    }
    if (!strcmp(type, maclen_ctrl_string)) {
        char *endptr;
        long size = strtol(value, &endptr, 10);
        if (*endptr != '\0') {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR, GOST_R_INVALID_MAC_SIZE);
            return 0;
        }
        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_MAC_LEN, size, NULL);
    }
    if (strcmp(type, param_ctrl_string) == 0) {
        ASN1_OBJECT *obj = OBJ_txt2obj(value, 0);
        const struct gost_cipher_info *param = NULL;
        if (obj == NULL) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR, GOST_R_INVALID_MAC_PARAMS);
            return 0;
        }

        param = get_encryption_params(obj);
        ASN1_OBJECT_free(obj);
        if (param == NULL) {
            GOSTerr(GOST_F_PKEY_GOST_MAC_CTRL_STR, GOST_R_INVALID_MAC_PARAMS);
            return 0;
        }


        return pkey_gost_mac_ctrl(ctx, EVP_PKEY_CTRL_GOST_PARAMSET, 0,
                                  (void *)param);
    }
    return -2;
}